

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

longlong __thiscall SchemePair::list_length(SchemePair *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Base_ptr p_Var3;
  SchemePair *pSVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  longlong lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<const_SchemePair_*> __l;
  SchemePair *p;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  allocator_type local_72;
  less<const_SchemePair_*> local_71;
  SchemePair *local_70;
  SchemePair *local_68;
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  local_60;
  
  __l._M_len = 1;
  __l._M_array = &local_68;
  local_70 = this;
  local_68 = this;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )&local_60,__l,&local_71,&local_72);
  lVar7 = -1;
  if (local_70 != (SchemePair *)0x0) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    lVar7 = 0;
    do {
      pSVar4 = local_70;
      if (local_70 ==
          (SchemePair *)
          scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      goto LAB_001272ab;
      peVar2 = (local_70->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        local_70 = (SchemePair *)0x0;
      }
      else {
        local_70 = (SchemePair *)__dynamic_cast(peVar2,&SchemeObject::typeinfo,&typeinfo,0);
      }
      if (local_70 == (SchemePair *)0x0) {
        local_70 = (SchemePair *)0x0;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        this_00 = (pSVar4->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      p_Var5 = &p_Var1->_M_header;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(SchemePair **)(p_Var3 + 1) < local_70]) {
        if (*(SchemePair **)(p_Var3 + 1) >= local_70) {
          p_Var5 = p_Var3;
        }
      }
      p_Var6 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var6 = (_Rb_tree_header *)p_Var5,
         local_70 < (SchemePair *)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var6 = p_Var1;
      }
      if (p_Var6 != p_Var1) {
        lVar7 = -2;
        goto LAB_001272ab;
      }
      std::
      _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
      ::_M_insert_unique<SchemePair_const*const&>
                ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                  *)&local_60,&local_70);
      lVar7 = lVar7 + 1;
    } while (local_70 != (SchemePair *)0x0);
    lVar7 = -1;
  }
LAB_001272ab:
  std::
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  ::~_Rb_tree(&local_60);
  return lVar7;
}

Assistant:

long long SchemePair::list_length() const
{
    const SchemePair *p = this;
    std::set<const SchemePair*> visited{p};
    for(long long ans=0;;++ans)
    {
        if(!p)
            return -1;
        if(p == scheme_nil.get())
            return ans;
        p = std::dynamic_pointer_cast<SchemePair>(p->cdr).get();
        if(visited.count(p))
            return -2;
        visited.insert(p);
    }
}